

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

int __thiscall
google::protobuf::DescriptorProto_ExtensionRange::ByteSize(DescriptorProto_ExtensionRange *this)

{
  bool bVar1;
  int32 iVar2;
  int iVar3;
  UnknownFieldSet *pUVar4;
  int local_14;
  int total_size;
  DescriptorProto_ExtensionRange *this_local;
  
  local_14 = 0;
  if ((this->_has_bits_[0] & 0xff) != 0) {
    bVar1 = has_start(this);
    if (bVar1) {
      iVar2 = start(this);
      local_14 = internal::WireFormatLite::Int32Size(iVar2);
      local_14 = local_14 + 1;
    }
    bVar1 = has_end(this);
    if (bVar1) {
      iVar2 = end(this);
      iVar3 = internal::WireFormatLite::Int32Size(iVar2);
      local_14 = iVar3 + 1 + local_14;
    }
  }
  pUVar4 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar4);
  if (!bVar1) {
    pUVar4 = unknown_fields(this);
    iVar3 = internal::WireFormat::ComputeUnknownFieldsSize(pUVar4);
    local_14 = iVar3 + local_14;
  }
  this->_cached_size_ = local_14;
  return local_14;
}

Assistant:

int DescriptorProto_ExtensionRange::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional int32 start = 1;
    if (has_start()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->start());
    }

    // optional int32 end = 2;
    if (has_end()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->end());
    }

  }
  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}